

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void findtest(void)

{
  char *__s1;
  char *pcVar1;
  char *pcVar2;
  void *pvVar3;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  int local_48;
  uint local_44;
  int c;
  int mid;
  int hi;
  int lo;
  char *realret2;
  char *realret;
  char *ret;
  char *p;
  int index;
  int rel;
  int j;
  int i;
  
  rel = 0;
  do {
    if (0x3b < (uint)rel) {
      pvVar3 = findrelpos234(tree,(void *)0x0,(cmpfn234)0x0,3,(int *)&p);
      if ((arraylen == 0) || ((pvVar3 == *array && ((uint)p == 0)))) {
        if ((arraylen == 0) && (pvVar3 != (void *)0x0)) {
          error("find(NULL,GT) gave %s(%d) should be NULL",pvVar3,(ulong)(uint)p);
        }
      }
      else {
        error("find(NULL,GT) gave %s(%d) should be %s(0)",pvVar3,(ulong)(uint)p,*array);
      }
      pvVar3 = findrelpos234(tree,(void *)0x0,(cmpfn234)0x0,1,(int *)&p);
      if ((arraylen == 0) || ((pvVar3 == array[arraylen + -1] && ((uint)p == arraylen - 1U)))) {
        if ((arraylen == 0) && (pvVar3 != (void *)0x0)) {
          error("find(NULL,LT) gave %s(%d) should be NULL",pvVar3,(ulong)(uint)p);
        }
      }
      else {
        error("find(NULL,LT) gave %s(%d) should be %s(0)",pvVar3,(ulong)(uint)p,array[arraylen + -1]
             );
      }
      return;
    }
    __s1 = strings[rel];
    for (index = 0; (uint)index < 5; index = index + 1) {
      p._4_4_ = findtest::rels[index];
      mid = 0;
      c = arraylen + -1;
      while (mid <= c) {
        local_44 = (mid + c) / 2;
        local_48 = strcmp(__s1,(char *)array[(int)local_44]);
        if (local_48 < 0) {
          c = local_44 - 1;
        }
        else {
          if (local_48 < 1) break;
          mid = local_44 + 1;
        }
      }
      if (local_48 == 0) {
        if (p._4_4_ == 1) {
          if ((int)local_44 < 1) {
            local_50 = (char *)0x0;
          }
          else {
            local_44 = local_44 - 1;
            local_50 = (char *)array[(int)local_44];
          }
          realret = local_50;
        }
        else if (p._4_4_ == 3) {
          if ((int)local_44 < arraylen + -1) {
            local_44 = local_44 + 1;
            local_58 = (char *)array[(int)local_44];
          }
          else {
            local_58 = (char *)0x0;
          }
          realret = local_58;
        }
        else {
          realret = (char *)array[(int)local_44];
        }
      }
      else {
        if (mid != c + 1) {
          __assert_fail("lo == hi + 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                        ,0x58c,"void findtest(void)");
        }
        if ((p._4_4_ == 1) || (p._4_4_ == 2)) {
          local_44 = c;
          if (c < 0) {
            local_60 = (char *)0x0;
          }
          else {
            local_60 = (char *)array[c];
          }
          realret = local_60;
        }
        else if ((p._4_4_ == 3) || (p._4_4_ == 4)) {
          local_44 = mid;
          if (mid < arraylen) {
            local_68 = (char *)array[mid];
          }
          else {
            local_68 = (char *)0x0;
          }
          realret = local_68;
        }
        else {
          realret = (char *)0x0;
        }
      }
      pcVar1 = (char *)findrelpos234(tree,__s1,(cmpfn234)0x0,p._4_4_,(int *)&p);
      if (pcVar1 != realret) {
        error("find(\"%s\",%s) gave %s should be %s",__s1,findtest::relnames[index],pcVar1,realret);
      }
      if ((pcVar1 != (char *)0x0) && ((uint)p != local_44)) {
        error("find(\"%s\",%s) gave %d should be %d",__s1,findtest::relnames[index],(ulong)(uint)p,
              (ulong)local_44);
      }
      if (((pcVar1 != (char *)0x0) && (p._4_4_ == 0)) &&
         (pcVar2 = (char *)index234(tree,(uint)p), pcVar2 != pcVar1)) {
        error("find(\"%s\",%s) gave %s(%d) but %d -> %s",__s1,findtest::relnames[index],pcVar1,
              (ulong)(uint)p,(ulong)(uint)p,pcVar2);
      }
      if (verbose != 0) {
        printf("find(\"%s\",%s) gave %s(%d)\n",__s1,findtest::relnames[index],pcVar1,(ulong)(uint)p)
        ;
      }
    }
    rel = rel + 1;
  } while( true );
}

Assistant:

void findtest(void)
{
    const static int rels[] = {
        REL234_EQ, REL234_GE, REL234_LE, REL234_LT, REL234_GT
    };
    const static char *const relnames[] = {
        "EQ", "GE", "LE", "LT", "GT"
    };
    int i, j, rel, index;
    char *p, *ret, *realret, *realret2;
    int lo, hi, mid, c;

    for (i = 0; i < NSTR; i++) {
        p = strings[i];
        for (j = 0; j < sizeof(rels) / sizeof(*rels); j++) {
            rel = rels[j];

            lo = 0;
            hi = arraylen - 1;
            while (lo <= hi) {
                mid = (lo + hi) / 2;
                c = strcmp(p, array[mid]);
                if (c < 0)
                    hi = mid - 1;
                else if (c > 0)
                    lo = mid + 1;
                else
                    break;
            }

            if (c == 0) {
                if (rel == REL234_LT)
                    ret = (mid > 0 ? array[--mid] : NULL);
                else if (rel == REL234_GT)
                    ret = (mid < arraylen - 1 ? array[++mid] : NULL);
                else
                    ret = array[mid];
            } else {
                assert(lo == hi + 1);
                if (rel == REL234_LT || rel == REL234_LE) {
                    mid = hi;
                    ret = (hi >= 0 ? array[hi] : NULL);
                } else if (rel == REL234_GT || rel == REL234_GE) {
                    mid = lo;
                    ret = (lo < arraylen ? array[lo] : NULL);
                } else
                    ret = NULL;
            }

            realret = findrelpos234(tree, p, NULL, rel, &index);
            if (realret != ret) {
                error("find(\"%s\",%s) gave %s should be %s",
                      p, relnames[j], realret, ret);
            }
            if (realret && index != mid) {
                error("find(\"%s\",%s) gave %d should be %d",
                      p, relnames[j], index, mid);
            }
            if (realret && rel == REL234_EQ) {
                realret2 = index234(tree, index);
                if (realret2 != realret) {
                    error("find(\"%s\",%s) gave %s(%d) but %d -> %s",
                          p, relnames[j], realret, index, index, realret2);
                }
            }
            if (verbose)
                printf("find(\"%s\",%s) gave %s(%d)\n", p, relnames[j],
                       realret, index);
        }
    }

    realret = findrelpos234(tree, NULL, NULL, REL234_GT, &index);
    if (arraylen && (realret != array[0] || index != 0)) {
        error("find(NULL,GT) gave %s(%d) should be %s(0)",
              realret, index, (char *)array[0]);
    } else if (!arraylen && (realret != NULL)) {
        error("find(NULL,GT) gave %s(%d) should be NULL", realret, index);
    }

    realret = findrelpos234(tree, NULL, NULL, REL234_LT, &index);
    if (arraylen
        && (realret != array[arraylen - 1] || index != arraylen - 1)) {
        error("find(NULL,LT) gave %s(%d) should be %s(0)", realret, index,
              (char *)array[arraylen - 1]);
    } else if (!arraylen && (realret != NULL)) {
        error("find(NULL,LT) gave %s(%d) should be NULL", realret, index);
    }
}